

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool google::protobuf::compiler::anon_unknown_0::IsMessageSetWireFormatMessage
               (DescriptorProto *message)

{
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *this;
  int iVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar3;
  int index;
  MessageOptions *p;
  
  if (message == (DescriptorProto *)0x0) {
    message = (DescriptorProto *)_MessageOptions_default_instance_;
  }
  index = 0;
  if (0 < *(int *)((long)&message->field_0 + 0x28)) {
    do {
      pVVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                         (&(message->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,index);
      if (*(int *)((long)&pVVar2->field_0 + 0x10) == 1) {
        this = &(pVVar2->field_0)._impl_.name_;
        pVVar3 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                           (&this->super_RepeatedPtrFieldBase,0);
        if ((pVVar3->field_0)._impl_.is_extension_ == false) {
          pVVar3 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                             (&this->super_RepeatedPtrFieldBase,0);
          iVar1 = std::__cxx11::string::compare
                            ((char *)((ulong)(pVVar3->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
          if (iVar1 == 0) {
            iVar1 = std::__cxx11::string::compare
                              ((char *)((ulong)(pVVar2->field_0)._impl_.identifier_value_.
                                               tagged_ptr_.ptr_ & 0xfffffffffffffffc));
            if (iVar1 == 0) {
              index = 1;
              goto LAB_00203e40;
            }
          }
        }
      }
      index = index + 1;
    } while (index < *(int *)((long)&message->field_0 + 0x28));
    index = 0;
  }
LAB_00203e40:
  return SUB41(index,0);
}

Assistant:

bool IsMessageSetWireFormatMessage(const DescriptorProto& message) {
  const MessageOptions& options = message.options();
  for (int i = 0; i < options.uninterpreted_option_size(); ++i) {
    const UninterpretedOption& uninterpreted = options.uninterpreted_option(i);
    if (uninterpreted.name_size() == 1 &&
        !uninterpreted.name(0).is_extension() &&
        uninterpreted.name(0).name_part() == "message_set_wire_format" &&
        uninterpreted.identifier_value() == "true") {
      return true;
    }
  }
  return false;
}